

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

CppStringType __thiscall google::protobuf::FieldDescriptor::cpp_string_type(FieldDescriptor *this)

{
  byte extraout_AL;
  byte bVar1;
  bool bVar2;
  int iVar3;
  int extraout_EAX;
  MessageLite *pMVar4;
  string *extraout_RAX;
  int *piVar5;
  const_reference piVar6;
  Rep *pRVar7;
  undefined8 extraout_RAX_00;
  string *psVar8;
  SourceLocation *out_location;
  SourceLocation *extraout_RAX_01;
  undefined7 extraout_var;
  undefined1 in_CL;
  FieldDescriptor *extraout_RDX;
  CppStringType CVar9;
  undefined1 *puVar10;
  FileDescriptor *this_00;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar11;
  SourceCodeInfo_Location *unaff_R14;
  RepeatedField<int> *unaff_R15;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  vector<int,_std::allocator<int>_> vStack_88;
  FieldDescriptor *pFStack_68;
  FieldDescriptor *pFStack_48;
  
  puVar10 = &stack0xffffffffffffffd8;
  if ((this->type_ == '\t') || (this->type_ == '\f')) {
    unaff_R14 = (SourceCodeInfo_Location *)&pb::cpp;
    pMVar4 = internal::ExtensionSet::GetMessage
                       (&(this->merged_features_->field_0)._impl_._extensions_,pb::cpp,
                        (MessageLite *)PTR__CppFeatures_default_instance__004db100);
    iVar3 = (int)pMVar4[1]._internal_metadata_.ptr_;
    if (iVar3 == 1) {
      return kView;
    }
    if (iVar3 == 3) {
      return kString;
    }
    if (iVar3 == 2) {
      if (this->type_ != '\f') {
        return kString;
      }
      bVar1 = this->field_0x1;
      in_CL = (bVar1 & 0x20) >> 5;
      if (0xbf < bVar1 != (bool)in_CL) goto LAB_001e792f;
      psVar8 = (string *)0x0;
    }
    else {
      pMVar4 = internal::ExtensionSet::GetMessage
                         (&(this->merged_features_->field_0)._impl_._extensions_,pb::cpp,
                          (MessageLite *)PTR__CppFeatures_default_instance__004db100);
      if (((ulong)pMVar4[1]._vptr_MessageLite & 1) == 0) {
        return kString;
      }
      cpp_string_type();
      bVar1 = extraout_AL;
LAB_001e792f:
      psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                         ((bool)in_CL,0xbf < bVar1,"is_repeated_ == label() == LABEL_REPEATED");
    }
    CVar9 = kString;
    if (psVar8 == (string *)0x0) {
      if ((this->field_0x1 & 0x20) == 0) {
        CVar9 = kString - ((this->field_0x1 & 8) == 0);
      }
      return CVar9;
    }
  }
  else {
    cpp_string_type();
    psVar8 = extraout_RAX;
  }
  cpp_string_type();
  pFStack_48 = this;
  if (extraout_RDX == (FieldDescriptor *)0x0) {
    pFStack_68 = (FieldDescriptor *)0x1e7b23;
    FileDescriptor::GetSourceLocation();
    iVar3 = extraout_EAX;
  }
  else {
    if (*(SourceCodeInfo **)(puVar10 + 0xa0) == (SourceCodeInfo *)0x0) {
      return 0;
    }
    pFStack_68 = (FieldDescriptor *)0x1e798f;
    unaff_R14 = FileDescriptorTables::GetSourceLocation
                          (*(FileDescriptorTables **)(puVar10 + 0x98),
                           (vector<int,_std::allocator<int>_> *)psVar8,
                           *(SourceCodeInfo **)(puVar10 + 0xa0));
    if (unaff_R14 == (SourceCodeInfo_Location *)0x0) {
      return 0;
    }
    unaff_R15 = &(unaff_R14->field_0)._impl_.span_;
    pFStack_68 = (FieldDescriptor *)0x1e79b1;
    iVar3 = internal::SooRep::size
                      (&unaff_R15->soo_rep_,(*(byte *)((long)&unaff_R14->field_0 + 0x20) & 4) == 0);
    if (iVar3 != 3) {
      pFStack_68 = (FieldDescriptor *)0x1e79c8;
      iVar3 = internal::SooRep::size
                        (&unaff_R15->soo_rep_,
                         (undefined1  [16])
                         ((undefined1  [16])(unaff_R15->soo_rep_).field_0 & (undefined1  [16])0x4)
                         == (undefined1  [16])0x0);
      if (iVar3 != 4) {
        return 0;
      }
    }
    pFStack_68 = (FieldDescriptor *)0x1e79e3;
    iVar3 = internal::SooRep::size
                      (&unaff_R15->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(unaff_R15->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    this = extraout_RDX;
    if (0 < iVar3) {
      psVar8 = (string *)0x0;
      goto LAB_001e79ed;
    }
  }
  pFStack_68 = (FieldDescriptor *)0x1e7b34;
  psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                     (0,(long)iVar3,"index < size()");
LAB_001e79ed:
  if (psVar8 == (string *)0x0) {
    pFStack_68 = (FieldDescriptor *)0x1e7a08;
    piVar5 = RepeatedField<int>::elements
                       (unaff_R15,
                        (undefined1  [16])
                        ((undefined1  [16])(unaff_R15->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                        (undefined1  [16])0x0);
    iVar3 = *piVar5;
    this->super_SymbolBase = (SymbolBase)(char)iVar3;
    this->field_0x1 = (char)((uint)iVar3 >> 8);
    this->type_ = (char)((uint)iVar3 >> 0x10);
    this->field_0x3 = (char)((uint)iVar3 >> 0x18);
    pFStack_68 = (FieldDescriptor *)0x1e7a1e;
    iVar3 = internal::SooRep::size
                      (&unaff_R15->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(unaff_R15->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    if (iVar3 < 2) {
      pFStack_68 = (FieldDescriptor *)0x1e7b4d;
      out_location = (SourceLocation *)
                     absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                               (1,(long)iVar3,"index < size()");
    }
    else {
      out_location = (SourceLocation *)0x0;
    }
    if (out_location == (SourceLocation *)0x0) {
      pFStack_68 = (FieldDescriptor *)0x1e7a45;
      piVar5 = RepeatedField<int>::elements
                         (unaff_R15,(*(byte *)((long)&unaff_R14->field_0 + 0x20) & 4) == 0);
      *(int *)&this->all_names_ = piVar5[1];
      pFStack_68 = (FieldDescriptor *)0x1e7a5e;
      iVar3 = internal::SooRep::size
                        (&unaff_R15->soo_rep_,(*(byte *)((long)&unaff_R14->field_0 + 0x20) & 4) == 0
                        );
      pFStack_68 = (FieldDescriptor *)0x1e7a71;
      piVar6 = RepeatedField<int>::Get(unaff_R15,(uint)(iVar3 != 3) * 2);
      this->number_ = *piVar6;
      pFStack_68 = (FieldDescriptor *)0x1e7a89;
      iVar3 = internal::SooRep::size
                        (&unaff_R15->soo_rep_,(*(byte *)((long)&unaff_R14->field_0 + 0x20) & 4) == 0
                        );
      pFStack_68 = (FieldDescriptor *)0x1e7a94;
      piVar6 = RepeatedField<int>::Get(unaff_R15,iVar3 + -1);
      *(int *)((long)&this->all_names_ + 4) = *piVar6;
      pFStack_68 = (FieldDescriptor *)0x1e7aaa;
      std::__cxx11::string::_M_assign((string *)&this->file_);
      pFStack_68 = (FieldDescriptor *)0x1e7abb;
      std::__cxx11::string::_M_assign((string *)&this->type_descriptor_);
      this_01 = &(unaff_R14->field_0)._impl_.leading_detached_comments_;
      pRVar11 = this_01;
      if ((*(byte *)((long)&unaff_R14->field_0 + 0x38) & 1) != 0) {
        pFStack_68 = (FieldDescriptor *)0x1e7ad4;
        pRVar7 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
        pRVar11 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)pRVar7->elements;
      }
      if (((ulong)(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
        pFStack_68 = (FieldDescriptor *)0x1e7aed;
        pRVar7 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
        this_01 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)pRVar7->elements;
      }
      pFStack_68 = (FieldDescriptor *)0x1e7b07;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::string_const>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->field_22,pRVar11,
                 &(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                 *(int *)((long)&unaff_R14->field_0 + 0x40));
      return (CppStringType)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
    }
  }
  else {
    pFStack_68 = (FieldDescriptor *)0x1e7b5f;
    FileDescriptor::GetSourceLocation();
    out_location = extraout_RAX_01;
  }
  this_00 = (FileDescriptor *)&stack0xffffffffffffffa8;
  pFStack_68 = (FieldDescriptor *)FileDescriptor::GetSourceLocation;
  FileDescriptor::GetSourceLocation();
  vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pFStack_68 = this;
  bVar2 = FileDescriptor::GetSourceLocation(this_00,&vStack_88,out_location);
  if (vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (CppStringType)CONCAT71(extraout_var,bVar2);
}

Assistant:

FieldDescriptor::CppStringType FieldDescriptor::cpp_string_type() const {
  ABSL_DCHECK(cpp_type() == FieldDescriptor::CPPTYPE_STRING);
  switch (features().GetExtension(pb::cpp).string_type()) {
    case pb::CppFeatures::VIEW:
      return CppStringType::kView;
    case pb::CppFeatures::CORD:
      // In open-source, protobuf CORD is only supported for singular bytes
      // fields.
      if (type() != FieldDescriptor::TYPE_BYTES || is_repeated() ||
          is_extension()) {
        return CppStringType::kString;
      }
      return CppStringType::kCord;
    case pb::CppFeatures::STRING:
      return CppStringType::kString;
    default:
      // If features haven't been resolved, this is a dynamic build not for C++
      // codegen.  Just use string type.
      ABSL_DCHECK(!features().GetExtension(pb::cpp).has_string_type());
      return CppStringType::kString;
  }
}